

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_rightclick(_glist *x,int xpos,int ypos,t_gobj *y)

{
  t_propertiesfn p_Var1;
  t_symbol *s;
  t_gotfn p_Var2;
  bool local_2a;
  bool local_29;
  int canopen;
  int canprop;
  t_gobj *y_local;
  int ypos_local;
  int xpos_local;
  _glist *x_local;
  
  local_29 = true;
  if (y != (t_gobj *)0x0) {
    p_Var1 = class_getpropertiesfn(y->g_pd);
    local_29 = p_Var1 != (t_propertiesfn)0x0;
  }
  local_2a = false;
  if (y != (t_gobj *)0x0) {
    s = gensym("menu-open");
    p_Var2 = zgetfn(&y->g_pd,s);
    local_2a = p_Var2 != (t_gotfn)0x0;
  }
  pdgui_vmess("pdtk_canvas_popup","^ ii ii",x,(ulong)(uint)xpos,(ulong)(uint)ypos,(ulong)local_29,
              (uint)local_2a);
  return;
}

Assistant:

static void canvas_rightclick(t_canvas *x, int xpos, int ypos, t_gobj *y)
{
    int canprop, canopen;
    canprop = (!y || class_getpropertiesfn(pd_class(&y->g_pd)));
    canopen = (y && zgetfn(&y->g_pd, gensym("menu-open")));
    pdgui_vmess("pdtk_canvas_popup", "^ ii ii",
        x,
        xpos, ypos,
        canprop, canopen);
}